

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

void pnga_get_proc_grid(Integer g_a,Integer *dims)

{
  short sVar1;
  long in_RSI;
  long in_RDI;
  char err_string_1 [256];
  char err_string [256];
  Integer ga_handle;
  Integer ndim;
  Integer i;
  char acStackY_228 [256];
  char local_128 [160];
  Integer in_stack_ffffffffffffff78;
  char *in_stack_ffffffffffffff80;
  long local_18;
  
  if ((in_RDI + 1000 < 0) || ((long)_max_global_array <= in_RDI + 1000)) {
    sprintf(local_128,"%s: INVALID ARRAY HANDLE","ga_get_proc_grid");
    pnga_error(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  if (GA[in_RDI + 1000].actv == 0) {
    sprintf(acStackY_228,"%s: ARRAY NOT ACTIVE","ga_get_proc_grid");
    pnga_error(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  sVar1 = GA[in_RDI + 1000].ndim;
  for (local_18 = 0; local_18 < sVar1; local_18 = local_18 + 1) {
    *(long *)(in_RSI + local_18 * 8) = (long)GA[in_RDI + 1000].nblock[local_18];
  }
  return;
}

Assistant:

void pnga_get_proc_grid(Integer g_a, Integer *dims)
{
  Integer i, ndim, ga_handle = GA_OFFSET + g_a;
  ga_check_handleM(g_a, "ga_get_proc_grid");
  ndim = GA[ga_handle].ndim;
  for (i=0; i<ndim; i++) {
    dims[i] = GA[ga_handle].nblock[i];
  }
}